

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageIO.cpp
# Opt level: O0

Image * nv::ImageIO::loadPSD(Stream *s)

{
  undefined8 uVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  Image *pIVar7;
  Color32 *pCVar8;
  uint local_8c;
  uint8 *puStack_88;
  uint count_1;
  uint8 *ptr_1;
  uint channel_1;
  uint8 val;
  uint len;
  uint uStack_6c;
  uint8 c;
  uint8 *puStack_68;
  uint count;
  uint8 *ptr;
  uint channel;
  uint pixel_count;
  AutoPtr<nv::Image> local_48;
  AutoPtr<nv::Image> img;
  uint channel_num;
  undefined1 local_34 [2];
  uint16 compression;
  int tmp;
  PsdHeader header;
  Stream *s_local;
  
  header._20_8_ = s;
  uVar4 = (*s->_vptr_Stream[6])();
  if (((uVar4 & 1) != 0) &&
     (iVar5 = nvAbort("!s.isError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/ImageIO.cpp"
                      ,0x1c3,"Image *nv::ImageIO::loadPSD(Stream &)"), iVar5 == 1)) {
    raise(5);
  }
  uVar6 = (**(code **)(*(long *)header._20_8_ + 0x50))();
  if (((uVar6 & 1) == 0) &&
     (iVar5 = nvAbort("s.isLoading()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/ImageIO.cpp"
                      ,0x1c4,"Image *nv::ImageIO::loadPSD(Stream &)"), iVar5 == 1)) {
    raise(5);
  }
  Stream::setByteOrder((Stream *)header._20_8_,BigEndian);
  nv::operator<<((Stream *)header._20_8_,(PsdHeader *)local_34);
  bVar2 = PsdHeader::isValid((PsdHeader *)local_34);
  if (bVar2) {
    bVar2 = PsdHeader::isSupported((PsdHeader *)local_34);
    if (bVar2) {
      nv::operator<<((Stream *)header._20_8_,(int32 *)&channel_num);
      uVar1 = header._20_8_;
      iVar5 = (**(code **)(*(long *)header._20_8_ + 0x20))();
      (**(code **)(*(long *)uVar1 + 0x18))(uVar1,iVar5 + channel_num);
      nv::operator<<((Stream *)header._20_8_,(int32 *)&channel_num);
      uVar1 = header._20_8_;
      iVar5 = (**(code **)(*(long *)header._20_8_ + 0x20))();
      (**(code **)(*(long *)uVar1 + 0x18))(uVar1,iVar5 + channel_num);
      nv::operator<<((Stream *)header._20_8_,(int32 *)&channel_num);
      uVar1 = header._20_8_;
      iVar5 = (**(code **)(*(long *)header._20_8_ + 0x20))();
      (**(code **)(*(long *)uVar1 + 0x18))(uVar1,iVar5 + channel_num);
      nv::operator<<((Stream *)header._20_8_,(uint16 *)((long)&img.m_ptr + 6));
      if (img.m_ptr._6_2_ < 2) {
        img.m_ptr._0_4_ = (uint)header.version;
        pIVar7 = (Image *)operator_new(0x18);
        Image::Image(pIVar7);
        AutoPtr<nv::Image>::AutoPtr(&local_48,pIVar7);
        pIVar7 = AutoPtr<nv::Image>::operator->(&local_48);
        Image::allocate(pIVar7,header._12_4_,header.reserved._2_4_);
        if ((uint)img.m_ptr < 4) {
          pIVar7 = AutoPtr<nv::Image>::operator->(&local_48);
          Color32::Color32((Color32 *)&channel,'\0','\0','\0',0xff);
          Image::fill(pIVar7,(Color32 *)&channel);
        }
        else {
          pIVar7 = AutoPtr<nv::Image>::operator->(&local_48);
          Image::setFormat(pIVar7,Format_ARGB);
          img.m_ptr._0_4_ = 4;
        }
        uVar1 = header._20_8_;
        ptr._4_4_ = header.reserved._2_4_ * header._12_4_;
        if (img.m_ptr._6_2_ == 0) {
          for (ptr_1._0_4_ = 0; (uint)ptr_1 < (uint)img.m_ptr; ptr_1._0_4_ = (uint)ptr_1 + 1) {
            pIVar7 = AutoPtr<nv::Image>::operator->(&local_48);
            pCVar8 = Image::pixels(pIVar7);
            puStack_88 = (uint8 *)((long)&pCVar8->field_0 + (ulong)loadPSD::components[(uint)ptr_1])
            ;
            for (local_8c = ptr._4_4_; local_8c != 0; local_8c = local_8c - 1) {
              nv::operator<<((Stream *)header._20_8_,puStack_88);
              puStack_88 = puStack_88 + 4;
            }
          }
        }
        else {
          iVar5 = (**(code **)(*(long *)header._20_8_ + 0x20))();
          (**(code **)(*(long *)uVar1 + 0x18))
                    (uVar1,iVar5 + header.reserved._2_4_ * (uint)header.version * 2);
          for (ptr._0_4_ = 0; (uint)ptr < (uint)img.m_ptr; ptr._0_4_ = (uint)ptr + 1) {
            pIVar7 = AutoPtr<nv::Image>::operator->(&local_48);
            pCVar8 = Image::pixels(pIVar7);
            puStack_68 = (uint8 *)((long)&pCVar8->field_0 + (ulong)loadPSD::components[(uint)ptr]);
            uStack_6c = 0;
            while (uStack_6c < ptr._4_4_) {
              bVar3 = (**(code **)(*(long *)header._20_8_ + 0x40))();
              if ((bVar3 & 1) != 0) {
                s_local = (Stream *)0x0;
                goto LAB_0029af99;
              }
              nv::operator<<((Stream *)header._20_8_,&val);
              channel_1 = (uint)val;
              if (channel_1 < 0x80) {
                channel_1 = channel_1 + 1;
                uStack_6c = channel_1 + uStack_6c;
                if (ptr._4_4_ < uStack_6c) {
                  s_local = (Stream *)0x0;
                  goto LAB_0029af99;
                }
                for (; channel_1 != 0; channel_1 = channel_1 - 1) {
                  nv::operator<<((Stream *)header._20_8_,puStack_68);
                  puStack_68 = puStack_68 + 4;
                }
              }
              else if (0x80 < channel_1) {
                channel_1 = (uint)(byte)~val;
                channel_1 = channel_1 + 2;
                uStack_6c = uStack_6c + channel_1;
                bVar3 = (**(code **)(*(long *)header._20_8_ + 0x40))();
                if (((bVar3 & 1) != 0) || (ptr._4_4_ < uStack_6c)) {
                  s_local = (Stream *)0x0;
                  goto LAB_0029af99;
                }
                nv::operator<<((Stream *)header._20_8_,(uint8 *)((long)&ptr_1 + 7));
                for (; channel_1 != 0; channel_1 = channel_1 - 1) {
                  *puStack_68 = ptr_1._7_1_;
                  puStack_68 = puStack_68 + 4;
                }
              }
            }
          }
        }
        s_local = (Stream *)AutoPtr<nv::Image>::release(&local_48);
LAB_0029af99:
        len = 1;
        AutoPtr<nv::Image>::~AutoPtr(&local_48);
      }
      else {
        s_local = (Stream *)0x0;
      }
    }
    else {
      printf("unsupported file!\n");
      s_local = (Stream *)0x0;
    }
  }
  else {
    printf("invalid header!\n");
    s_local = (Stream *)0x0;
  }
  return (Image *)s_local;
}

Assistant:

Image * nv::ImageIO::loadPSD(Stream & s)
{
	nvCheck(!s.isError());
	nvCheck(s.isLoading());
	
	s.setByteOrder(Stream::BigEndian);
	
	PsdHeader header;
	s << header;
	
	if (!header.isValid())
	{
		printf("invalid header!\n");
		return NULL;
	}
	
	if (!header.isSupported())
	{
		printf("unsupported file!\n");
		return NULL;
	}
	
	int tmp;
	
	// Skip mode data.
	s << tmp;
	s.seek(s.tell() + tmp);

	// Skip image resources.
	s << tmp;
	s.seek(s.tell() + tmp);
	
	// Skip the reserved data.
	s << tmp;
	s.seek(s.tell() + tmp);
	
	// Find out if the data is compressed.
	// Known values:
	//   0: no compression
	//   1: RLE compressed
	uint16 compression;
	s << compression;
	
	if (compression > 1) {
		// Unknown compression type.
		return NULL;
	}
	
	uint channel_num = header.channel_count;
	
	AutoPtr<Image> img(new Image());
	img->allocate(header.width, header.height);
	
	if (channel_num < 4)
	{
		// Clear the image.
		img->fill(Color32(0, 0, 0, 0xFF));
	}
	else
	{
		// Enable alpha.
		img->setFormat(Image::Format_ARGB);
		
		// Ignore remaining channels.
		channel_num = 4;
	}
	
	
	const uint pixel_count = header.height * header.width;
	
	static const uint components[4] = {2, 1, 0, 3};
	
	if (compression)
	{
		s.seek(s.tell() + header.height * header.channel_count * sizeof(uint16));
		
		// Read RLE data.						
		for (uint channel = 0; channel < channel_num; channel++)
		{
			uint8 * ptr = (uint8 *)img->pixels() + components[channel];
			
			uint count = 0;
			while( count < pixel_count )
			{
				if (s.isAtEnd()) return NULL;
				
				uint8 c;
				s << c;
				
				uint len = c;
				if (len < 128)
				{
					// Copy next len+1 bytes literally.
					len++;
					count += len;
					if (count > pixel_count) return NULL;
	
					while (len != 0)
					{
						s << *ptr;
						ptr += 4;
						len--;
					}
				} 
				else if (len > 128)
				{
					// Next -len+1 bytes in the dest are replicated from next source byte.
					// (Interpret len as a negative 8-bit int.)
					len ^= 0xFF;
					len += 2;
					count += len;
					if (s.isAtEnd() || count > pixel_count) return NULL;
					
					uint8 val;
					s << val;
					while( len != 0 ) {
						*ptr = val;
						ptr += 4;
						len--;
					}
				}
				else if( len == 128 ) {
					// No-op.
				}
			}
		}
	}
	else
	{
		// We're at the raw image data. It's each channel in order (Red, Green, Blue, Alpha, ...)
		// where each channel consists of an 8-bit value for each pixel in the image.
		
		// Read the data by channel.
		for (uint channel = 0; channel < channel_num; channel++)
		{
			uint8 * ptr = (uint8 *)img->pixels() + components[channel];
			
			// Read the data.
			uint count = pixel_count;
			while (count != 0)
			{
				s << *ptr;
				ptr += 4;
				count--;
			}
		}
	}

	return img.release();
}